

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ulong uVar31;
  ulong uVar32;
  float fVar33;
  undefined4 uVar34;
  float fVar45;
  float fVar46;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  vfloat4 v_2;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar64;
  vfloat4 v_3;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar65;
  vfloat4 v_1;
  vfloat4 v;
  float fVar66;
  float fVar73;
  float fVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar75;
  float fVar79;
  float fVar80;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar81;
  float fVar82;
  float fVar85;
  float fVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar87;
  uint uVar88;
  uint uVar91;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  uint uVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar102;
  float fVar103;
  undefined1 auVar98 [16];
  float fVar104;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 local_118 [16];
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  undefined1 local_e8 [16];
  
  pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar7 + uVar5 * sVar8);
  fVar87 = *pfVar1;
  fVar46 = pfVar1[1];
  fVar47 = pfVar1[2];
  pfVar2 = (float *)(pcVar7 + (uVar5 + 1) * sVar8);
  fVar65 = *pfVar2;
  fVar74 = pfVar2[1];
  fVar75 = pfVar2[2];
  pfVar3 = (float *)(pcVar7 + (uVar5 + 2) * sVar8);
  fVar80 = *pfVar3;
  fVar81 = pfVar3[1];
  fVar82 = pfVar3[2];
  pfVar4 = (float *)(pcVar7 + (uVar5 + 3) * sVar8);
  fVar86 = *pfVar4;
  fVar64 = pfVar4[1];
  fVar10 = pfVar4[2];
  fVar85 = (space->vx).field_0.m128[0];
  fVar11 = (space->vx).field_0.m128[1];
  fVar12 = (space->vx).field_0.m128[2];
  fVar13 = (space->vy).field_0.m128[0];
  fVar14 = (space->vy).field_0.m128[1];
  fVar15 = (space->vy).field_0.m128[2];
  fVar16 = (space->vz).field_0.m128[0];
  fVar17 = (space->vz).field_0.m128[1];
  fVar18 = (space->vz).field_0.m128[2];
  fVar33 = fVar87 * fVar85 + fVar46 * fVar13 + fVar47 * fVar16;
  fVar45 = fVar87 * fVar11 + fVar46 * fVar14 + fVar47 * fVar17;
  fVar46 = fVar87 * fVar12 + fVar46 * fVar15 + fVar47 * fVar18;
  fVar87 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar47 = pfVar1[3] * fVar87;
  fVar66 = fVar65 * fVar85 + fVar74 * fVar13 + fVar75 * fVar16;
  fVar73 = fVar65 * fVar11 + fVar74 * fVar14 + fVar75 * fVar17;
  fVar74 = fVar65 * fVar12 + fVar74 * fVar15 + fVar75 * fVar18;
  fVar65 = pfVar2[3] * fVar87;
  fVar75 = fVar80 * fVar85 + fVar81 * fVar13 + fVar82 * fVar16;
  fVar79 = fVar80 * fVar11 + fVar81 * fVar14 + fVar82 * fVar17;
  fVar80 = fVar80 * fVar12 + fVar81 * fVar15 + fVar82 * fVar18;
  fVar81 = pfVar3[3] * fVar87;
  fVar82 = fVar86 * fVar85 + fVar64 * fVar13 + fVar10 * fVar16;
  fVar85 = fVar86 * fVar11 + fVar64 * fVar14 + fVar10 * fVar17;
  fVar86 = fVar86 * fVar12 + fVar64 * fVar15 + fVar10 * fVar18;
  fVar87 = pfVar4[3] * fVar87;
  uVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar31 = (ulong)uVar5;
  if (uVar31 == 4) {
    auVar83._0_4_ =
         fVar33 * (float)bspline_basis0._272_4_ +
         fVar66 * (float)bspline_basis0._1428_4_ +
         fVar75 * (float)bspline_basis0._2584_4_ + fVar82 * (float)bspline_basis0._3740_4_;
    auVar83._4_4_ =
         fVar33 * (float)bspline_basis0._276_4_ +
         fVar66 * (float)bspline_basis0._1432_4_ +
         fVar75 * (float)bspline_basis0._2588_4_ + fVar82 * (float)bspline_basis0._3744_4_;
    auVar83._8_4_ =
         fVar33 * (float)bspline_basis0._280_4_ +
         fVar66 * (float)bspline_basis0._1436_4_ +
         fVar75 * (float)bspline_basis0._2592_4_ + fVar82 * (float)bspline_basis0._3748_4_;
    auVar83._12_4_ =
         fVar33 * (float)bspline_basis0._284_4_ +
         fVar66 * (float)bspline_basis0._1440_4_ +
         fVar75 * (float)bspline_basis0._2596_4_ + fVar82 * (float)bspline_basis0._3752_4_;
    auVar76._0_4_ =
         fVar45 * (float)bspline_basis0._272_4_ +
         fVar73 * (float)bspline_basis0._1428_4_ +
         fVar79 * (float)bspline_basis0._2584_4_ + fVar85 * (float)bspline_basis0._3740_4_;
    auVar76._4_4_ =
         fVar45 * (float)bspline_basis0._276_4_ +
         fVar73 * (float)bspline_basis0._1432_4_ +
         fVar79 * (float)bspline_basis0._2588_4_ + fVar85 * (float)bspline_basis0._3744_4_;
    auVar76._8_4_ =
         fVar45 * (float)bspline_basis0._280_4_ +
         fVar73 * (float)bspline_basis0._1436_4_ +
         fVar79 * (float)bspline_basis0._2592_4_ + fVar85 * (float)bspline_basis0._3748_4_;
    auVar76._12_4_ =
         fVar45 * (float)bspline_basis0._284_4_ +
         fVar73 * (float)bspline_basis0._1440_4_ +
         fVar79 * (float)bspline_basis0._2596_4_ + fVar85 * (float)bspline_basis0._3752_4_;
    auVar35._0_4_ =
         fVar46 * (float)bspline_basis0._272_4_ +
         fVar74 * (float)bspline_basis0._1428_4_ +
         fVar80 * (float)bspline_basis0._2584_4_ + fVar86 * (float)bspline_basis0._3740_4_;
    auVar35._4_4_ =
         fVar46 * (float)bspline_basis0._276_4_ +
         fVar74 * (float)bspline_basis0._1432_4_ +
         fVar80 * (float)bspline_basis0._2588_4_ + fVar86 * (float)bspline_basis0._3744_4_;
    auVar35._8_4_ =
         fVar46 * (float)bspline_basis0._280_4_ +
         fVar74 * (float)bspline_basis0._1436_4_ +
         fVar80 * (float)bspline_basis0._2592_4_ + fVar86 * (float)bspline_basis0._3748_4_;
    auVar35._12_4_ =
         fVar46 * (float)bspline_basis0._284_4_ +
         fVar74 * (float)bspline_basis0._1440_4_ +
         fVar80 * (float)bspline_basis0._2596_4_ + fVar86 * (float)bspline_basis0._3752_4_;
    fVar46 = fVar47 * (float)bspline_basis0._272_4_ +
             fVar65 * (float)bspline_basis0._1428_4_ +
             fVar81 * (float)bspline_basis0._2584_4_ + fVar87 * (float)bspline_basis0._3740_4_;
    fVar64 = fVar47 * (float)bspline_basis0._276_4_ +
             fVar65 * (float)bspline_basis0._1432_4_ +
             fVar81 * (float)bspline_basis0._2588_4_ + fVar87 * (float)bspline_basis0._3744_4_;
    auVar89._0_8_ = CONCAT44(auVar83._0_4_,auVar83._4_4_);
    auVar89._8_4_ = auVar83._12_4_;
    auVar89._12_4_ = auVar83._8_4_;
    auVar67._8_4_ = auVar83._12_4_;
    auVar67._0_8_ = auVar89._0_8_;
    auVar67._12_4_ = auVar83._8_4_;
    auVar68 = minps(auVar67,auVar83);
    auVar93._0_8_ = auVar68._8_8_;
    auVar93._8_4_ = auVar68._0_4_;
    auVar93._12_4_ = auVar68._4_4_;
    auVar94 = minps(auVar93,auVar68);
    auVar98._0_8_ = CONCAT44(auVar76._0_4_,auVar76._4_4_);
    auVar98._8_4_ = auVar76._12_4_;
    auVar98._12_4_ = auVar76._8_4_;
    auVar105._8_4_ = auVar76._12_4_;
    auVar105._0_8_ = auVar98._0_8_;
    auVar105._12_4_ = auVar76._8_4_;
    auVar68 = minps(auVar105,auVar76);
    auVar69._0_8_ = auVar68._8_8_;
    auVar69._8_4_ = auVar68._0_4_;
    auVar69._12_4_ = auVar68._4_4_;
    auVar68 = minps(auVar69,auVar68);
    auVar95._0_8_ = CONCAT44(auVar35._0_4_,auVar35._4_4_);
    auVar95._8_4_ = auVar35._12_4_;
    auVar95._12_4_ = auVar35._8_4_;
    auVar106._8_4_ = auVar35._12_4_;
    auVar106._0_8_ = auVar95._0_8_;
    auVar106._12_4_ = auVar35._8_4_;
    auVar107 = minps(auVar106,auVar35);
    auVar110._0_8_ = auVar107._8_8_;
    auVar110._8_4_ = auVar107._0_4_;
    auVar110._12_4_ = auVar107._4_4_;
    auVar107 = minps(auVar110,auVar107);
    auVar70._4_4_ = auVar68._0_4_;
    auVar70._0_4_ = auVar94._0_4_;
    auVar70._8_4_ = auVar107._0_4_;
    auVar70._12_4_ = 0;
    auVar68 = maxps(auVar89,auVar83);
    auVar84._0_8_ = auVar68._8_8_;
    auVar84._8_4_ = auVar68._0_4_;
    auVar84._12_4_ = auVar68._4_4_;
    auVar107 = maxps(auVar84,auVar68);
    auVar68 = maxps(auVar98,auVar76);
    auVar77._0_8_ = auVar68._8_8_;
    auVar77._8_4_ = auVar68._0_4_;
    auVar77._12_4_ = auVar68._4_4_;
    auVar94 = maxps(auVar77,auVar68);
    auVar68 = maxps(auVar95,auVar35);
    auVar36._0_8_ = auVar68._8_8_;
    auVar36._8_4_ = auVar68._0_4_;
    auVar36._12_4_ = auVar68._4_4_;
    auVar68 = maxps(auVar36,auVar68);
    auVar78._4_4_ = auVar94._0_4_;
    auVar78._0_4_ = auVar107._0_4_;
    auVar78._8_4_ = auVar68._0_4_;
    auVar78._12_4_ = 0;
    auVar58._0_8_ = CONCAT44(fVar64,fVar46) & 0x7fffffff7fffffff;
    auVar58._8_4_ =
         ABS(fVar47 * (float)bspline_basis0._280_4_ +
             fVar65 * (float)bspline_basis0._1436_4_ +
             fVar81 * (float)bspline_basis0._2592_4_ + fVar87 * (float)bspline_basis0._3748_4_);
    auVar58._12_4_ =
         ABS(fVar47 * (float)bspline_basis0._284_4_ +
             fVar65 * (float)bspline_basis0._1440_4_ +
             fVar81 * (float)bspline_basis0._2596_4_ + fVar87 * (float)bspline_basis0._3752_4_);
    auVar37._0_8_ = CONCAT44(fVar46,fVar64) & 0x7fffffff7fffffff;
    auVar37._8_4_ = auVar58._12_4_;
    auVar37._12_4_ = auVar58._8_4_;
    auVar68 = maxps(auVar37,auVar58);
    uVar34 = auVar68._0_4_;
    auVar38._8_4_ = auVar68._8_4_;
    auVar59._4_4_ = uVar34;
    auVar59._0_4_ = uVar34;
    auVar59._8_4_ = uVar34;
    auVar59._12_4_ = uVar34;
    auVar38._4_4_ = auVar38._8_4_;
    auVar38._0_4_ = auVar38._8_4_;
    auVar38._12_4_ = auVar38._8_4_;
    auVar68 = maxps(auVar38,auVar59);
    auVar48._0_4_ = fVar66 * 0.16666667 + fVar75 * 0.6666667 + fVar82 * 0.16666667;
    auVar48._4_4_ = fVar73 * 0.16666667 + fVar79 * 0.6666667 + fVar85 * 0.16666667;
    auVar48._8_4_ = fVar74 * 0.16666667 + fVar80 * 0.6666667 + fVar86 * 0.16666667;
    auVar48._12_4_ = fVar65 * 0.16666667 + fVar81 * 0.6666667 + fVar87 * 0.16666667;
    auVar94 = minps(auVar70,auVar48);
    auVar107 = maxps(auVar78,auVar48);
    uVar31 = CONCAT44(auVar48._12_4_,auVar48._12_4_);
    auVar49._0_8_ = uVar31 & 0x7fffffff7fffffff;
    auVar49._8_4_ = ABS(auVar48._12_4_);
    auVar49._12_4_ = ABS(auVar48._12_4_);
    auVar68 = maxps(auVar68,auVar49);
    fVar74 = auVar94._0_4_ - auVar68._0_4_;
    fVar75 = auVar94._4_4_ - auVar68._4_4_;
    fVar80 = auVar94._8_4_ - auVar68._8_4_;
    fVar81 = auVar94._12_4_ - auVar68._12_4_;
    fVar87 = auVar68._0_4_ + auVar107._0_4_;
    fVar46 = auVar68._4_4_ + auVar107._4_4_;
    fVar47 = auVar68._8_4_ + auVar107._8_4_;
    fVar65 = auVar68._12_4_ + auVar107._12_4_;
  }
  else {
    if ((int)uVar5 < 0) {
      auVar107 = ZEXT816(0);
      local_e8 = _DAT_01f7aa00;
      local_108 = 0x7f800000;
      uStack_104 = 0x7f800000;
      uStack_100 = 0x7f800000;
      uStack_fc = 0x7f800000;
      local_118._8_8_ = 0x7f8000007f800000;
      local_118._0_8_ = 0x7f8000007f800000;
      local_f8 = 0x7f800000;
      uStack_f4 = 0x7f800000;
      uStack_f0 = 0x7f800000;
      uStack_ec = 0x7f800000;
      auVar68 = _DAT_01f7aa00;
      auVar94 = _DAT_01f7aa00;
    }
    else {
      lVar9 = uVar31 * 0x44;
      auVar107 = ZEXT816(0);
      uVar32 = 0;
      local_108 = 0x7f800000;
      uStack_104 = 0x7f800000;
      uStack_100 = 0x7f800000;
      uStack_fc = 0x7f800000;
      local_f8 = 0x7f800000;
      uStack_f4 = 0x7f800000;
      uStack_f0 = 0x7f800000;
      uStack_ec = 0x7f800000;
      local_118._8_8_ = 0x7f8000007f800000;
      local_118._0_8_ = 0x7f8000007f800000;
      local_e8 = _DAT_01f7aa00;
      auVar68 = _DAT_01f7aa00;
      auVar94 = _DAT_01f7aa00;
      do {
        uVar88 = (uint)uVar32;
        auVar96._0_4_ = -(uint)((int)uVar5 < (int)uVar88);
        auVar96._4_4_ = -(uint)((int)uVar5 < (int)(uVar88 | 1));
        auVar96._8_4_ = -(uint)((int)uVar5 < (int)(uVar88 | 2));
        auVar96._12_4_ = -(uint)((int)uVar5 < (int)(uVar88 | 3));
        pfVar1 = (float *)(lVar9 + 0x21af430 + uVar32 * 4);
        fVar64 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        pfVar1 = (float *)(lVar9 + 0x21af8b4 + uVar32 * 4);
        fVar13 = *pfVar1;
        fVar14 = pfVar1[1];
        fVar15 = pfVar1[2];
        fVar16 = pfVar1[3];
        pfVar1 = (float *)(lVar9 + 0x21aefac + uVar32 * 4);
        fVar17 = *pfVar1;
        fVar18 = pfVar1[1];
        fVar19 = pfVar1[2];
        fVar20 = pfVar1[3];
        pfVar1 = (float *)(bspline_basis0 + uVar32 * 4 + lVar9);
        fVar21 = *pfVar1;
        fVar22 = pfVar1[1];
        fVar23 = pfVar1[2];
        fVar24 = pfVar1[3];
        fVar112 = fVar33 * fVar21 + fVar66 * fVar17 + fVar75 * fVar64 + fVar82 * fVar13;
        fVar113 = fVar33 * fVar22 + fVar66 * fVar18 + fVar75 * fVar10 + fVar82 * fVar14;
        fVar114 = fVar33 * fVar23 + fVar66 * fVar19 + fVar75 * fVar11 + fVar82 * fVar15;
        fVar115 = fVar33 * fVar24 + fVar66 * fVar20 + fVar75 * fVar12 + fVar82 * fVar16;
        fVar116 = fVar45 * fVar21 + fVar73 * fVar17 + fVar79 * fVar64 + fVar85 * fVar13;
        fVar117 = fVar45 * fVar22 + fVar73 * fVar18 + fVar79 * fVar10 + fVar85 * fVar14;
        fVar118 = fVar45 * fVar23 + fVar73 * fVar19 + fVar79 * fVar11 + fVar85 * fVar15;
        fVar119 = fVar45 * fVar24 + fVar73 * fVar20 + fVar79 * fVar12 + fVar85 * fVar16;
        fVar97 = fVar46 * fVar21 + fVar74 * fVar17 + fVar80 * fVar64 + fVar86 * fVar13;
        fVar102 = fVar46 * fVar22 + fVar74 * fVar18 + fVar80 * fVar10 + fVar86 * fVar14;
        fVar103 = fVar46 * fVar23 + fVar74 * fVar19 + fVar80 * fVar11 + fVar86 * fVar15;
        fVar104 = fVar46 * fVar24 + fVar74 * fVar20 + fVar80 * fVar12 + fVar86 * fVar16;
        auVar52._4_4_ = fVar113;
        auVar52._0_4_ = fVar112;
        auVar52._8_4_ = fVar114;
        auVar52._12_4_ = fVar115;
        auVar90 = minps(local_118,auVar52);
        auVar99._0_4_ = local_118._0_4_ & auVar96._0_4_;
        auVar99._4_4_ = local_118._4_4_ & auVar96._4_4_;
        auVar99._8_4_ = local_118._8_4_ & auVar96._8_4_;
        auVar99._12_4_ = local_118._12_4_ & auVar96._12_4_;
        local_118 = auVar99 | ~auVar96 & auVar90;
        auVar25._4_4_ = uStack_104;
        auVar25._0_4_ = local_108;
        auVar25._8_4_ = uStack_100;
        auVar25._12_4_ = uStack_fc;
        auVar63._4_4_ = fVar117;
        auVar63._0_4_ = fVar116;
        auVar63._8_4_ = fVar118;
        auVar63._12_4_ = fVar119;
        auVar90 = minps(auVar25,auVar63);
        local_108 = local_108 & auVar96._0_4_ | ~auVar96._0_4_ & auVar90._0_4_;
        uStack_104 = uStack_104 & auVar96._4_4_ | ~auVar96._4_4_ & auVar90._4_4_;
        uStack_100 = uStack_100 & auVar96._8_4_ | ~auVar96._8_4_ & auVar90._8_4_;
        uStack_fc = uStack_fc & auVar96._12_4_ | ~auVar96._12_4_ & auVar90._12_4_;
        auVar27._4_4_ = uStack_f4;
        auVar27._0_4_ = local_f8;
        auVar27._8_4_ = uStack_f0;
        auVar27._12_4_ = uStack_ec;
        auVar29._4_4_ = fVar102;
        auVar29._0_4_ = fVar97;
        auVar29._8_4_ = fVar103;
        auVar29._12_4_ = fVar104;
        auVar90 = minps(auVar27,auVar29);
        local_f8 = local_f8 & auVar96._0_4_ | ~auVar96._0_4_ & auVar90._0_4_;
        uStack_f4 = uStack_f4 & auVar96._4_4_ | ~auVar96._4_4_ & auVar90._4_4_;
        uStack_f0 = uStack_f0 & auVar96._8_4_ | ~auVar96._8_4_ & auVar90._8_4_;
        uStack_ec = uStack_ec & auVar96._12_4_ | ~auVar96._12_4_ & auVar90._12_4_;
        uVar88 = local_e8._0_4_;
        uVar92 = local_e8._12_4_;
        auVar54._4_4_ = fVar113;
        auVar54._0_4_ = fVar112;
        auVar54._8_4_ = fVar114;
        auVar54._12_4_ = fVar115;
        auVar90 = maxps(local_e8,auVar54);
        uVar91 = local_e8._8_4_;
        local_e8._4_4_ = local_e8._4_4_ & auVar96._4_4_ | ~auVar96._4_4_ & auVar90._4_4_;
        local_e8._0_4_ = uVar88 & auVar96._0_4_ | ~auVar96._0_4_ & auVar90._0_4_;
        local_e8._8_4_ = uVar91 & auVar96._8_4_ | ~auVar96._8_4_ & auVar90._8_4_;
        local_e8._12_4_ = uVar92 & auVar96._12_4_ | ~auVar96._12_4_ & auVar90._12_4_;
        auVar72._4_4_ = fVar117;
        auVar72._0_4_ = fVar116;
        auVar72._8_4_ = fVar118;
        auVar72._12_4_ = fVar119;
        auVar90 = maxps(auVar94,auVar72);
        auVar108._0_4_ = ~auVar96._0_4_ & auVar90._0_4_;
        auVar108._4_4_ = ~auVar96._4_4_ & auVar90._4_4_;
        auVar108._8_4_ = ~auVar96._8_4_ & auVar90._8_4_;
        auVar108._12_4_ = ~auVar96._12_4_ & auVar90._12_4_;
        auVar111._0_4_ = auVar94._0_4_ & auVar96._0_4_;
        auVar111._4_4_ = auVar94._4_4_ & auVar96._4_4_;
        auVar111._8_4_ = auVar94._8_4_ & auVar96._8_4_;
        auVar111._12_4_ = auVar94._12_4_ & auVar96._12_4_;
        auVar94 = auVar111 | auVar108;
        auVar30._4_4_ = fVar102;
        auVar30._0_4_ = fVar97;
        auVar30._8_4_ = fVar103;
        auVar30._12_4_ = fVar104;
        auVar90 = maxps(auVar68,auVar30);
        auVar100._0_4_ = ~auVar96._0_4_ & auVar90._0_4_;
        auVar100._4_4_ = ~auVar96._4_4_ & auVar90._4_4_;
        auVar100._8_4_ = ~auVar96._8_4_ & auVar90._8_4_;
        auVar100._12_4_ = ~auVar96._12_4_ & auVar90._12_4_;
        auVar109._0_4_ = auVar68._0_4_ & auVar96._0_4_;
        auVar109._4_4_ = auVar68._4_4_ & auVar96._4_4_;
        auVar109._8_4_ = auVar68._8_4_ & auVar96._8_4_;
        auVar109._12_4_ = auVar68._12_4_ & auVar96._12_4_;
        auVar68 = auVar109 | auVar100;
        auVar90._8_4_ = ABS(fVar23 * fVar47 + fVar19 * fVar65 + fVar11 * fVar81 + fVar15 * fVar87);
        auVar90._0_8_ =
             CONCAT44(fVar22 * fVar47 + fVar18 * fVar65 + fVar10 * fVar81 + fVar14 * fVar87,
                      fVar21 * fVar47 + fVar17 * fVar65 + fVar64 * fVar81 + fVar13 * fVar87) &
             0x7fffffff7fffffff;
        auVar90._12_4_ = ABS(fVar24 * fVar47 + fVar20 * fVar65 + fVar12 * fVar81 + fVar16 * fVar87);
        auVar90 = maxps(auVar107,auVar90);
        auVar101._0_4_ = auVar107._0_4_ & auVar96._0_4_;
        auVar101._4_4_ = auVar107._4_4_ & auVar96._4_4_;
        auVar101._8_4_ = auVar107._8_4_ & auVar96._8_4_;
        auVar101._12_4_ = auVar107._12_4_ & auVar96._12_4_;
        auVar107._0_4_ = ~auVar96._0_4_ & auVar90._0_4_;
        auVar107._4_4_ = ~auVar96._4_4_ & auVar90._4_4_;
        auVar107._8_4_ = ~auVar96._8_4_ & auVar90._8_4_;
        auVar107._12_4_ = ~auVar96._12_4_ & auVar90._12_4_;
        auVar107 = auVar107 | auVar101;
        uVar32 = uVar32 + 4;
      } while (uVar32 <= uVar31);
    }
    auVar39._4_4_ = local_118._0_4_;
    auVar39._0_4_ = local_118._4_4_;
    auVar39._8_4_ = local_118._12_4_;
    auVar39._12_4_ = local_118._8_4_;
    auVar90 = minps(auVar39,local_118);
    auVar51._0_8_ = auVar90._8_8_;
    auVar51._8_4_ = auVar90._0_4_;
    auVar51._12_4_ = auVar90._4_4_;
    auVar52 = minps(auVar51,auVar90);
    auVar26._4_4_ = uStack_104;
    auVar26._0_4_ = local_108;
    auVar26._8_4_ = uStack_100;
    auVar26._12_4_ = uStack_fc;
    auVar40._4_4_ = local_108;
    auVar40._0_4_ = uStack_104;
    auVar40._8_4_ = uStack_fc;
    auVar40._12_4_ = uStack_100;
    auVar90 = minps(auVar40,auVar26);
    auVar71._0_8_ = auVar90._8_8_;
    auVar71._8_4_ = auVar90._0_4_;
    auVar71._12_4_ = auVar90._4_4_;
    auVar72 = minps(auVar71,auVar90);
    auVar28._4_4_ = uStack_f4;
    auVar28._0_4_ = local_f8;
    auVar28._8_4_ = uStack_f0;
    auVar28._12_4_ = uStack_ec;
    auVar41._4_4_ = local_f8;
    auVar41._0_4_ = uStack_f4;
    auVar41._8_4_ = uStack_ec;
    auVar41._12_4_ = uStack_f0;
    auVar90 = minps(auVar41,auVar28);
    auVar53._0_8_ = auVar90._8_8_;
    auVar53._8_4_ = auVar90._0_4_;
    auVar53._12_4_ = auVar90._4_4_;
    auVar54 = minps(auVar53,auVar90);
    auVar42._4_4_ = local_e8._0_4_;
    auVar42._0_4_ = local_e8._4_4_;
    auVar42._8_4_ = local_e8._12_4_;
    auVar42._12_4_ = local_e8._8_4_;
    auVar90 = maxps(auVar42,local_e8);
    auVar55._0_8_ = auVar90._8_8_;
    auVar55._8_4_ = auVar90._0_4_;
    auVar55._12_4_ = auVar90._4_4_;
    auVar90 = maxps(auVar55,auVar90);
    auVar43._4_4_ = auVar94._0_4_;
    auVar43._0_4_ = auVar94._4_4_;
    auVar43._8_4_ = auVar94._12_4_;
    auVar43._12_4_ = auVar94._8_4_;
    auVar94 = maxps(auVar43,auVar94);
    auVar62._0_8_ = auVar94._8_8_;
    auVar62._8_4_ = auVar94._0_4_;
    auVar62._12_4_ = auVar94._4_4_;
    auVar63 = maxps(auVar62,auVar94);
    auVar94._4_4_ = auVar68._0_4_;
    auVar94._0_4_ = auVar68._4_4_;
    auVar94._8_4_ = auVar68._12_4_;
    auVar94._12_4_ = auVar68._8_4_;
    auVar68 = maxps(auVar94,auVar68);
    auVar56._0_8_ = auVar68._8_8_;
    auVar56._8_4_ = auVar68._0_4_;
    auVar56._12_4_ = auVar68._4_4_;
    auVar94 = maxps(auVar56,auVar68);
    auVar68._4_4_ = auVar107._0_4_;
    auVar68._0_4_ = auVar107._4_4_;
    auVar68._8_4_ = auVar107._12_4_;
    auVar68._12_4_ = auVar107._8_4_;
    auVar68 = maxps(auVar68,auVar107);
    uVar34 = auVar68._0_4_;
    auVar44._8_4_ = auVar68._8_4_;
    auVar57._4_4_ = uVar34;
    auVar57._0_4_ = uVar34;
    auVar57._8_4_ = uVar34;
    auVar57._12_4_ = uVar34;
    auVar44._4_4_ = auVar44._8_4_;
    auVar44._0_4_ = auVar44._8_4_;
    auVar44._12_4_ = auVar44._8_4_;
    auVar68 = maxps(auVar44,auVar57);
    fVar74 = auVar52._0_4_ - auVar68._0_4_;
    fVar75 = auVar72._0_4_ - auVar68._4_4_;
    fVar80 = auVar54._0_4_ - auVar68._8_4_;
    fVar81 = 0.0 - auVar68._12_4_;
    fVar87 = auVar68._0_4_ + auVar90._0_4_;
    fVar46 = auVar68._4_4_ + auVar63._0_4_;
    fVar47 = auVar68._8_4_ + auVar94._0_4_;
    fVar65 = auVar68._12_4_ + 0.0;
  }
  auVar60._0_8_ = CONCAT44(fVar75,fVar74) & 0x7fffffff7fffffff;
  auVar60._8_4_ = ABS(fVar80);
  auVar60._12_4_ = ABS(fVar81);
  auVar50._0_8_ = CONCAT44(fVar46,fVar87) & 0x7fffffff7fffffff;
  auVar50._8_4_ = ABS(fVar47);
  auVar50._12_4_ = ABS(fVar65);
  auVar68 = maxps(auVar60,auVar50);
  fVar82 = auVar68._4_4_;
  if (auVar68._4_4_ <= auVar68._0_4_) {
    fVar82 = auVar68._0_4_;
  }
  auVar61._8_8_ = auVar68._8_8_;
  auVar61._0_8_ = auVar68._8_8_;
  if (auVar68._8_4_ <= fVar82) {
    auVar61._0_4_ = fVar82;
  }
  fVar82 = auVar61._0_4_ * 4.7683716e-07;
  (__return_storage_ptr__->lower).field_0.m128[0] = fVar74 - fVar82;
  (__return_storage_ptr__->lower).field_0.m128[1] = fVar75 - fVar82;
  (__return_storage_ptr__->lower).field_0.m128[2] = fVar80 - fVar82;
  (__return_storage_ptr__->lower).field_0.m128[3] = fVar81 - fVar82;
  (__return_storage_ptr__->upper).field_0.m128[0] = fVar82 + fVar87;
  (__return_storage_ptr__->upper).field_0.m128[1] = fVar82 + fVar46;
  (__return_storage_ptr__->upper).field_0.m128[2] = fVar82 + fVar47;
  (__return_storage_ptr__->upper).field_0.m128[3] = fVar82 + fVar65;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }